

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hrtime.c
# Opt level: O1

int run_test_hrtime(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar2;
  long lVar3;
  uv_timer_t *puVar4;
  undefined8 uVar5;
  uint uVar6;
  uv_idle_t *puVar7;
  uv_check_t *puVar8;
  
  uVar6 = 0x4c;
  while( true ) {
    lVar2 = uv_hrtime();
    uv_sleep(0x2d);
    lVar3 = uv_hrtime();
    if ((ulong)(lVar3 - lVar2) < 0x17d7841) break;
    uVar6 = uVar6 - 1;
    if (uVar6 < 2) {
      return 0;
    }
  }
  run_test_hrtime_cold_1();
  puVar4 = (uv_timer_t *)uv_default_loop();
  iVar1 = uv_idle_init(puVar4,&idle_handle);
  if (iVar1 == 0) {
    puVar7 = &idle_handle;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    puVar4 = (uv_timer_t *)puVar7;
    if (iVar1 != 0) goto LAB_0015cfec;
    puVar4 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_check_init(puVar4,&check_handle);
    if (iVar1 != 0) goto LAB_0015cff1;
    puVar8 = &check_handle;
    iVar1 = uv_check_start(&check_handle,check_cb);
    puVar4 = (uv_timer_t *)puVar8;
    if (iVar1 != 0) goto LAB_0015cff6;
    puVar4 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar4,&timer_handle);
    if (iVar1 != 0) goto LAB_0015cffb;
    puVar4 = &timer_handle;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 != 0) goto LAB_0015d000;
    puVar4 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_run(puVar4,0);
    if (iVar1 != 0) goto LAB_0015d005;
    if (idle_cb_called < 1) goto LAB_0015d00a;
    if (timer_cb_called != 1) goto LAB_0015d00f;
    if (close_cb_called == 3) {
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      puVar4 = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015d019;
    }
  }
  else {
    run_test_idle_starvation_cold_1();
LAB_0015cfec:
    run_test_idle_starvation_cold_2();
LAB_0015cff1:
    run_test_idle_starvation_cold_3();
LAB_0015cff6:
    run_test_idle_starvation_cold_4();
LAB_0015cffb:
    run_test_idle_starvation_cold_5();
LAB_0015d000:
    run_test_idle_starvation_cold_6();
LAB_0015d005:
    run_test_idle_starvation_cold_7();
LAB_0015d00a:
    run_test_idle_starvation_cold_8();
LAB_0015d00f:
    run_test_idle_starvation_cold_9();
  }
  run_test_idle_starvation_cold_10();
LAB_0015d019:
  run_test_idle_starvation_cold_11();
  if (puVar4 == (uv_timer_t *)&idle_handle) {
    idle_cb_cold_2();
    return extraout_EAX;
  }
  idle_cb_cold_1();
  if (puVar4 == (uv_timer_t *)&check_handle) {
    check_cb_cold_2();
    return extraout_EAX_00;
  }
  check_cb_cold_1();
  if (puVar4 == &timer_handle) {
    timer_cb_cold_2();
    return extraout_EAX_01;
  }
  timer_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(hrtime) {
  uint64_t a, b, diff;
  int i = 75;
  while (i > 0) {
    a = uv_hrtime();
    uv_sleep(45);
    b = uv_hrtime();

    diff = b - a;

    /* The windows Sleep() function has only a resolution of 10-20 ms. Check
     * that the difference between the two hrtime values has a reasonable
     * lower bound.
     */
    ASSERT(diff > (uint64_t) 25 * NANOSEC / MILLISEC);
    --i;
  }
  return 0;
}